

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O0

int __thiscall
QTableViewPrivate::widthHintForIndex
          (QTableViewPrivate *this,QModelIndex *index,int hint,QStyleOptionViewItem *option)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  QTableView *pQVar4;
  long *plVar5;
  int *piVar6;
  Span *this_00;
  undefined8 in_RCX;
  int in_EDX;
  QModelIndex *in_RSI;
  QTableViewPrivate *in_RDI;
  long in_FS_OFFSET;
  int i;
  int left;
  Span *span;
  QTableView *q;
  int max;
  int min;
  QWidget *editor;
  int oldHint;
  undefined4 in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  int *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  int local_78;
  int local_40;
  QSize local_3c;
  int local_34;
  QSize local_30;
  int local_28;
  undefined8 local_24;
  int local_1c;
  QWidget *local_18;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_c = in_EDX;
  pQVar4 = q_func(in_RDI);
  local_10 = local_c;
  QAbstractItemViewPrivate::editorForIndex
            ((QAbstractItemViewPrivate *)
             CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
             (QModelIndex *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  local_18 = QPointer<QWidget>::data((QPointer<QWidget> *)0x8b4efb);
  if ((local_18 != (QWidget *)0x0) &&
     (bVar1 = QSet<QWidget_*>::contains
                        ((QSet<QWidget_*> *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         (QWidget **)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48)),
     bVar1)) {
    local_24 = (**(code **)(*(long *)local_18 + 0x70))();
    local_1c = QSize::width((QSize *)0x8b4f57);
    piVar6 = qMax<int>(&local_c,&local_1c);
    local_c = *piVar6;
    local_30 = QWidget::minimumSize
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_28 = QSize::width((QSize *)0x8b4f9e);
    local_3c = QWidget::maximumSize
                         ((QWidget *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
    local_34 = QSize::width((QSize *)0x8b4fc1);
    piVar6 = qBound<int>((int *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         in_stack_ffffffffffffff58,
                         (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    local_c = *piVar6;
  }
  plVar5 = (long *)(**(code **)(*(long *)&(pQVar4->super_QAbstractItemView).
                                          super_QAbstractScrollArea.super_QFrame.super_QWidget +
                               0x208))(pQVar4,in_RSI);
  (**(code **)(*plVar5 + 0x68))(plVar5,in_RCX,in_RSI);
  local_40 = QSize::width((QSize *)0x8b5023);
  piVar6 = qMax<int>(&local_c,&local_40);
  local_c = *piVar6;
  bVar1 = hasSpans((QTableViewPrivate *)0x8b504c);
  if (bVar1) {
    QModelIndex::column(in_RSI);
    QModelIndex::row(in_RSI);
    this_00 = QSpanCollection::spanAt
                        ((QSpanCollection *)
                         CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                         (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
                         (int)in_stack_ffffffffffffff58);
    if (this_00 != (Span *)0x0) {
      iVar3 = this_00->m_left;
      iVar2 = QModelIndex::column(in_RSI);
      if (iVar3 == iVar2) {
        iVar3 = this_00->m_top;
        iVar2 = QModelIndex::row(in_RSI);
        if (iVar3 == iVar2) {
          logicalColumn((QTableViewPrivate *)
                        CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                        in_stack_ffffffffffffff4c);
          local_78 = 1;
          while (iVar3 = local_78, iVar2 = QSpanCollection::Span::width(this_00), iVar3 <= iVar2) {
            visualColumn((QTableViewPrivate *)
                         CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                         in_stack_ffffffffffffff4c);
            iVar3 = QTableView::columnWidth
                              ((QTableView *)
                               CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                               in_stack_ffffffffffffff4c);
            local_c = local_c - iVar3;
            local_78 = local_78 + 1;
          }
        }
      }
    }
    piVar6 = std::max<int>(&local_c,&local_10);
    local_c = *piVar6;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_c;
}

Assistant:

int QTableViewPrivate::widthHintForIndex(const QModelIndex &index, int hint, const QStyleOptionViewItem &option) const
{
    Q_Q(const QTableView);
    const int oldHint = hint;
    QWidget *editor = editorForIndex(index).widget.data();
    if (editor && persistent.contains(editor)) {
        hint = qMax(hint, editor->sizeHint().width());
        int min = editor->minimumSize().width();
        int max = editor->maximumSize().width();
        hint = qBound(min, hint, max);
    }
    hint = qMax(hint, q->itemDelegateForIndex(index)->sizeHint(option, index).width());

    if (hasSpans()) {
        auto span = spans.spanAt(index.column(), index.row());
        if (span && span->m_left == index.column() && span->m_top == index.row()) {
            // spans are screwed up when sections are moved
            const auto left = logicalColumn(span->m_left);
            for (int i = 1; i <= span->width(); ++i)
               hint -= q->columnWidth(visualColumn(left + i));
        }
        hint = std::max(hint, oldHint);
    }
    return hint;
}